

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator=
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *fadexpr)

{
  uint ssize;
  Fad<Fad<double>_> *pFVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  value_type local_58;
  Fad<Fad<double>_> *local_38;
  
  ssize = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  uVar4 = (ulong)ssize;
  if (ssize != *(uint *)(this + 0x28)) {
    Vector<Fad<double>_>::resize((Vector<Fad<double>_> *)(this + 0x28),ssize);
  }
  local_38 = (Fad<Fad<double>_> *)this;
  if (uVar4 != 0) {
    pdVar2 = *(double **)(this + 0x30);
    if ((((fadexpr->fadexpr_).right_)->dx_).num_elts == 0) {
      if (0 < (int)ssize) {
        uVar3 = 0;
        do {
          FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::dx
                    (&local_58,&fadexpr->fadexpr_,(int)uVar3);
          *pdVar2 = local_58.val_;
          Vector<double>::operator=((Vector<double> *)(pdVar2 + 1),&local_58.dx_);
          pdVar2[3] = local_58.defaultVal;
          Fad<double>::~Fad(&local_58);
          uVar3 = uVar3 + 1;
          pdVar2 = pdVar2 + 4;
        } while (uVar4 != uVar3);
      }
    }
    else if (0 < (int)ssize) {
      uVar3 = 0;
      do {
        FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::fastAccessDx
                  (&local_58,&fadexpr->fadexpr_,(int)uVar3);
        *pdVar2 = local_58.val_;
        Vector<double>::operator=((Vector<double> *)(pdVar2 + 1),&local_58.dx_);
        pdVar2[3] = local_58.defaultVal;
        Fad<double>::~Fad(&local_58);
        uVar3 = uVar3 + 1;
        pdVar2 = pdVar2 + 4;
      } while (uVar4 != uVar3);
    }
  }
  FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::val(&local_58,&fadexpr->fadexpr_);
  pFVar1 = local_38;
  (local_38->val_).val_ = local_58.val_;
  Vector<double>::operator=(&(local_38->val_).dx_,&local_58.dx_);
  (pFVar1->val_).defaultVal = local_58.defaultVal;
  Fad<double>::~Fad(&local_58);
  return pFVar1;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}